

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O2

void __thiscall fsbridge::FileLock::FileLock(FileLock *this,path *file)

{
  int iVar1;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (this->reason)._M_dataplus._M_p = (pointer)&(this->reason).field_2;
  (this->reason)._M_string_length = 0;
  (this->reason).field_2._M_local_buf[0] = '\0';
  this->fd = -1;
  iVar1 = open((file->super_path)._M_pathname._M_dataplus._M_p,2);
  this->fd = iVar1;
  if (iVar1 == -1) {
    GetErrorReason_abi_cxx11_();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->reason,&bStack_38);
    std::__cxx11::string::~string((string *)&bStack_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

FileLock::FileLock(const fs::path& file)
{
    fd = open(file.c_str(), O_RDWR);
    if (fd == -1) {
        reason = GetErrorReason();
    }
}